

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O0

void ContextSetup(jpeg_decompress_struct *cinfo,JPEGReadContext *ctx)

{
  JPEGReadContext *ctx_local;
  jpeg_decompress_struct *cinfo_local;
  
  cinfo->src = &ctx->pub;
  (ctx->pub).init_source = ContextInit;
  (ctx->pub).fill_input_buffer = ContextFill;
  (ctx->pub).skip_input_data = ContextSkip;
  (ctx->pub).resync_to_restart = jpeg_resync_to_restart;
  (ctx->pub).term_source = ContextTerm;
  (ctx->pub).bytes_in_buffer = 0;
  (ctx->pub).next_input_byte = (JOCTET *)0x0;
  return;
}

Assistant:

static void ContextSetup(volatile struct jpeg_decompress_struct* const cinfo,
                         JPEGReadContext* const ctx) {
  cinfo->src = (struct jpeg_source_mgr*)ctx;
  ctx->pub.init_source = ContextInit;
  ctx->pub.fill_input_buffer = ContextFill;
  ctx->pub.skip_input_data = ContextSkip;
  ctx->pub.resync_to_restart = jpeg_resync_to_restart;
  ctx->pub.term_source = ContextTerm;
  ctx->pub.bytes_in_buffer = 0;
  ctx->pub.next_input_byte = NULL;
}